

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigIsoSlow.c
# Opt level: O2

void Iso_ManPrintClasseSizes(Iso_Man_t *p)

{
  Iso_Obj_t *pIVar1;
  int i;
  ulong uVar2;
  
  for (i = 0; i < p->vClasses->nSize; i = i + 1) {
    pIVar1 = (Iso_Obj_t *)Vec_PtrEntry(p->vClasses,i);
    uVar2 = 0;
    for (; pIVar1 != (Iso_Obj_t *)0x0; pIVar1 = Iso_ManObj(p,pIVar1->iClass)) {
      uVar2 = (ulong)((int)uVar2 + 1);
    }
    printf("%d ",uVar2);
  }
  putchar(10);
  return;
}

Assistant:

void Iso_ManPrintClasseSizes( Iso_Man_t * p )
{
    Iso_Obj_t * pIso, * pTemp;
    int i, Counter;
    Vec_PtrForEachEntry( Iso_Obj_t *, p->vClasses, pIso, i )
    {
        Counter = 0;
        for ( pTemp = pIso; pTemp; pTemp = Iso_ManObj(p, pTemp->iClass) )
            Counter++;
        printf( "%d ", Counter );
    }
    printf( "\n" );
}